

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ParseContext *this_00;
  bool bVar1;
  string *s;
  OneofOptions *msg;
  ulong tag_00;
  UnknownFieldSet *unknown;
  string *str;
  uint32_t tag;
  HasBits has_bits;
  ParseContext *ctx_local;
  char *ptr_local;
  OneofDescriptorProto *this_local;
  
  _tag = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
  internal::HasBits<1UL>::HasBits((HasBits<1UL> *)((long)&str + 4));
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done(_tag,(char **)&ctx_local);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_006a0d1e;
      ctx_local = (ParseContext *)internal::ReadTag((char *)ctx_local,(uint32_t *)&str,0);
      this_00 = _tag;
      if ((uint)str >> 3 != 1) break;
      if (((uint)str & 0xff) == 10) {
        s = _internal_mutable_name_abi_cxx11_(this);
        ctx_local = (ParseContext *)internal::InlineGreedyStringParser(s,(char *)ctx_local,_tag);
        internal::VerifyUTF8(s,"google.protobuf.OneofDescriptorProto.name");
      }
      else {
LAB_006a0ca8:
        if (((uint)str == 0) || (((uint)str & 7) == 4)) {
          if (ctx_local != (ParseContext *)0x0) {
            internal::EpsCopyInputStream::SetLastTag(&_tag->super_EpsCopyInputStream,(uint)str);
            goto LAB_006a0d1e;
          }
          goto LAB_006a0d39;
        }
        tag_00 = (ulong)(uint)str;
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                            (&(this->super_Message).super_MessageLite._internal_metadata_);
        ctx_local = (ParseContext *)
                    internal::UnknownFieldParse(tag_00,unknown,(char *)ctx_local,_tag);
      }
      if (ctx_local == (ParseContext *)0x0) goto LAB_006a0d39;
    }
    if (((uint)str >> 3 != 2) || (((uint)str & 0xff) != 0x12)) goto LAB_006a0ca8;
    msg = _internal_mutable_options(this);
    ctx_local = (ParseContext *)
                internal::ParseContext::ParseMessage(this_00,(MessageLite *)msg,(char *)ctx_local);
  } while (ctx_local != (ParseContext *)0x0);
LAB_006a0d39:
  ctx_local = (ParseContext *)0x0;
LAB_006a0d1e:
  internal::HasBits<1UL>::Or(&this->_has_bits_,(HasBits<1UL> *)((long)&str + 4));
  return (char *)ctx_local;
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.OneofDescriptorProto.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}